

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFactorExtend.cpp
# Opt level: O3

void __thiscall HFactor::addRows(HFactor *this,HighsSparseMatrix *ar_matrix)

{
  vector<int,_std::allocator<int>_> *this_00;
  vector<int,_std::allocator<int>_> *this_01;
  int *piVar1;
  HighsInt *pHVar2;
  pointer piVar3;
  pointer piVar4;
  iterator iVar5;
  iterator iVar6;
  pointer pdVar7;
  bool bVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  vector<double,std::allocator<double>> *this_02;
  HighsInt HVar11;
  MatrixFormat MVar12;
  int iVar13;
  int iVar14;
  long lVar15;
  ulong uVar16;
  size_type sVar17;
  ulong uVar18;
  size_type sVar19;
  long lVar20;
  size_type __n;
  long lVar21;
  long lVar22;
  long lVar23;
  ulong uVar24;
  uint uVar25;
  int iVar26;
  uint uVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  int iVar36;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  HighsInt u_countX;
  vector<int,_std::allocator<int>_> ur_temp;
  HighsSparseMatrix new_lr_rows;
  vector<int,_std::allocator<int>_> in_basis;
  HighsSparseMatrix new_lr_cols;
  HVector rhs;
  double local_248;
  int local_238;
  int local_234;
  vector<double,std::allocator<double>> *local_230;
  ulong local_228;
  ulong local_220;
  pointer local_218;
  ulong local_210;
  vector<int,_std::allocator<int>_> *local_208;
  size_type local_200;
  vector<int,_std::allocator<int>_> local_1f8;
  vector<int,_std::allocator<int>_> *local_1e0;
  undefined1 local_1d8 [64];
  vector<int,_std::allocator<int>_> local_198;
  vector<double,_std::allocator<double>_> local_180;
  vector<int,_std::allocator<int>_> local_168;
  HighsSparseMatrix local_150;
  HVectorBase<double> local_e0;
  
  invalidAMatrixAction(this);
  local_228 = (ulong)(uint)ar_matrix->num_row_;
  local_210 = (ulong)(uint)this->num_row;
  uVar25 = this->num_row + ar_matrix->num_row_;
  uVar24 = (ulong)uVar25;
  printf("Adding %d new rows to HFactor instance: increasing dimension from %d to %d \n",local_228,
         local_210,uVar24);
  local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_e0.size = -1;
  std::vector<int,_std::allocator<int>_>::_M_fill_assign
            (&local_168,(long)this->num_col,&local_e0.size);
  iVar13 = this->num_row;
  if (0 < iVar13) {
    pHVar2 = this->basic_index;
    lVar20 = 0;
    do {
      if (pHVar2[lVar20] < this->num_col) {
        local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[pHVar2[lVar20]] = (int)lVar20;
        iVar13 = this->num_row;
      }
      lVar20 = lVar20 + 1;
    } while (lVar20 < iVar13);
  }
  HighsSparseMatrix::HighsSparseMatrix((HighsSparseMatrix *)local_1d8);
  local_1d8._0_4_ = kRowwise;
  local_1d8._4_4_ = this->num_row;
  local_e0.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  local_e0.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  local_e0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_e0.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  local_e0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_e0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_e0.cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_e0.cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_e0.cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_e0.iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_e0.iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_e0.iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_e0.packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_e0.packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_e0.packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_e0.packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_e0.packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e0.packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  HVectorBase<double>::setup(&local_e0,local_1d8._4_4_);
  local_208 = &this->lr_start;
  local_200 = (size_type)(int)(uVar25 + 1);
  std::vector<int,_std::allocator<int>_>::reserve(local_208,local_200);
  local_220 = uVar24;
  if (0 < (int)local_228) {
    local_230 = (vector<double,std::allocator<double>> *)&this->lr_value;
    local_248 = 0.0;
    uVar24 = 0;
    do {
      HVectorBase<double>::clear(&local_e0);
      local_e0.packFlag = true;
      piVar3 = (ar_matrix->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar1 = piVar3 + uVar24;
      lVar20 = (long)*piVar1;
      iVar13 = piVar3[uVar24 + 1];
      uVar24 = uVar24 + 1;
      if (*piVar1 < iVar13) {
        piVar4 = (ar_matrix->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        do {
          iVar14 = local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[piVar4[lVar20]];
          if (-1 < (long)iVar14) {
            local_e0.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[iVar14] =
                 (ar_matrix->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar20];
            lVar23 = (long)local_e0.count;
            local_e0.count = local_e0.count + 1;
            local_e0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[lVar23] = iVar14;
            iVar13 = piVar3[uVar24];
          }
          lVar20 = lVar20 + 1;
        } while (lVar20 < iVar13);
      }
      btranU(this,&local_e0,local_248,(HighsTimerClock *)0x0);
      local_218 = (pointer)(((double)local_e0.count / (double)this->num_row) * 0.05);
      HVectorBase<double>::tight(&local_e0);
      HVar11 = local_e0.count;
      lVar20 = (long)local_e0.count;
      if (0 < lVar20) {
        lVar23 = 0;
        do {
          local_150.format_ =
               local_e0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[lVar23];
          if (local_198.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_198.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)&local_198,
                       (iterator)
                       local_198.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish,(int *)&local_150);
          }
          else {
            *local_198.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_finish = local_e0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar23];
            local_198.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish = local_198.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish + 1;
          }
          if (local_180.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_180.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                      ((vector<double,std::allocator<double>> *)&local_180,
                       (iterator)
                       local_180.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish,
                       local_e0.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start + (int)local_150.format_);
          }
          else {
            *local_180.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish =
                 local_e0.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[(int)local_150.format_];
            local_180.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_180.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          lVar23 = lVar23 + 1;
        } while (lVar20 != lVar23);
      }
      MVar12 = (MatrixFormat)
               ((ulong)((long)local_198.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)local_198.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 2);
      if (local_1d8._24_8_ == local_1d8._32_8_) {
        local_150.format_ = MVar12;
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  ((vector<int,_std::allocator<int>_> *)(local_1d8 + 0x10),
                   (iterator)local_1d8._24_8_,(int *)&local_150);
      }
      else {
        *(MatrixFormat *)local_1d8._24_8_ = MVar12;
        local_1d8._24_8_ = local_1d8._24_8_ + 4;
      }
      local_1d8._8_4_ = local_1d8._8_4_ + 1;
      if (0 < HVar11) {
        lVar23 = 0;
        do {
          local_150.format_ =
               local_e0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[lVar23];
          iVar5._M_current =
               (this->lr_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar5._M_current ==
              (this->lr_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)&this->lr_index,iVar5,(int *)&local_150);
          }
          else {
            *iVar5._M_current = local_150.format_;
            (this->lr_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar5._M_current + 1;
          }
          iVar6._M_current =
               (this->lr_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar6._M_current ==
              (this->lr_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                      (local_230,iVar6,
                       local_e0.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start + (int)local_150.format_);
          }
          else {
            *iVar6._M_current =
                 local_e0.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[(int)local_150.format_];
            (this->lr_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar6._M_current + 1;
          }
          lVar23 = lVar23 + 1;
        } while (lVar20 != lVar23);
      }
      local_150.format_ =
           (MatrixFormat)
           ((ulong)((long)(this->lr_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)(this->lr_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start) >> 2);
      iVar5._M_current =
           (this->lr_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar5._M_current ==
          (this->lr_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (local_208,iVar5,(int *)&local_150);
        uVar25 = (uint)local_220;
      }
      else {
        *iVar5._M_current = local_150.format_;
        (this->lr_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar5._M_current + 1;
        uVar25 = (uint)local_220;
      }
      local_248 = local_248 * 0.95 + (double)local_218;
    } while (uVar24 != local_228);
  }
  local_150.num_row_ = local_1d8._8_4_;
  local_150.num_col_ = local_1d8._4_4_;
  local_150.format_ = local_1d8._0_4_;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_150.start_,(vector<int,_std::allocator<int>_> *)(local_1d8 + 0x10));
  std::vector<int,_std::allocator<int>_>::vector
            (&local_150.p_end_,(vector<int,_std::allocator<int>_> *)(local_1d8 + 0x28));
  std::vector<int,_std::allocator<int>_>::vector(&local_150.index_,&local_198);
  std::vector<double,_std::allocator<double>_>::vector(&local_150.value_,&local_180);
  HighsSparseMatrix::ensureColwise(&local_150);
  this_00 = &this->l_pivot_index;
  std::vector<int,_std::allocator<int>_>::resize(this_00,(long)(int)uVar25);
  auVar10 = _DAT_003beea0;
  auVar9 = _DAT_003bee90;
  lVar20 = (long)(int)local_228;
  lVar23 = (long)(int)local_210;
  iVar13 = this->num_row;
  if (iVar13 < (int)uVar25) {
    lVar15 = (long)iVar13;
    piVar3 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar21 = (lVar20 + lVar23) - lVar15;
    lVar22 = lVar21 + -1;
    auVar28._8_4_ = (int)lVar22;
    auVar28._0_8_ = lVar22;
    auVar28._12_4_ = (int)((ulong)lVar22 >> 0x20);
    uVar24 = 0;
    auVar28 = auVar28 ^ _DAT_003beea0;
    do {
      auVar32._8_4_ = (int)uVar24;
      auVar32._0_8_ = uVar24;
      auVar32._12_4_ = (int)(uVar24 >> 0x20);
      auVar32 = (auVar32 | auVar9) ^ auVar10;
      bVar8 = auVar28._0_4_ < auVar32._0_4_;
      iVar14 = auVar28._4_4_;
      iVar36 = auVar32._4_4_;
      if ((bool)(~(iVar14 < iVar36 || iVar36 == iVar14 && bVar8) & 1)) {
        piVar3[lVar15 + uVar24] = iVar13;
      }
      if (iVar14 >= iVar36 && (iVar36 != iVar14 || !bVar8)) {
        piVar3[lVar15 + uVar24 + 1] = iVar13 + 1;
      }
      uVar24 = uVar24 + 2;
      iVar13 = iVar13 + 2;
    } while ((lVar21 + 1U & 0xfffffffffffffffe) != uVar24);
  }
  piVar3 = (this->lr_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  piVar4 = (this->lr_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  this_01 = &this->l_start;
  local_210 = (long)(int)uVar25;
  std::vector<int,_std::allocator<int>_>::resize(this_01,local_200);
  auVar28 = _DAT_003bf640;
  auVar10 = _DAT_003beea0;
  auVar9 = _DAT_003bee90;
  uVar24 = (ulong)((long)piVar3 - (long)piVar4) >> 2;
  lVar15 = (long)this->num_row;
  iVar13 = (int)uVar24;
  if (this->num_row < (int)uVar25) {
    piVar3 = (this_01->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar21 = (lVar20 + lVar23) - lVar15;
    lVar22 = lVar21 + -1;
    auVar29._8_4_ = (int)lVar22;
    auVar29._0_8_ = lVar22;
    auVar29._12_4_ = (int)((ulong)lVar22 >> 0x20);
    uVar16 = 0;
    auVar29 = auVar29 ^ _DAT_003beea0;
    do {
      auVar33._8_4_ = (int)uVar16;
      auVar33._0_8_ = uVar16;
      auVar33._12_4_ = (int)(uVar16 >> 0x20);
      auVar32 = (auVar33 | auVar9) ^ auVar10;
      iVar14 = auVar29._4_4_;
      if ((bool)(~(iVar14 < auVar32._4_4_ ||
                  auVar29._0_4_ < auVar32._0_4_ && auVar32._4_4_ == iVar14) & 1)) {
        piVar3[lVar15 + uVar16 + 1] = iVar13;
      }
      if (auVar32._12_4_ <= auVar29._12_4_ &&
          (auVar32._8_4_ <= auVar29._8_4_ || auVar32._12_4_ != auVar29._12_4_)) {
        piVar3[lVar15 + uVar16 + 2] = iVar13;
      }
      auVar32 = (auVar33 | auVar28) ^ auVar10;
      iVar36 = auVar32._4_4_;
      if (iVar36 <= iVar14 && (iVar36 != iVar14 || auVar32._0_4_ <= auVar29._0_4_)) {
        piVar3[lVar15 + uVar16 + 3] = iVar13;
        piVar3[lVar15 + uVar16 + 4] = iVar13;
      }
      uVar16 = uVar16 + 4;
    } while ((lVar21 + 3U & 0xfffffffffffffffc) != uVar16);
  }
  local_208 = (vector<int,_std::allocator<int>_> *)lVar20;
  local_200 = lVar23;
  local_1e0 = this_00;
  std::vector<int,_std::allocator<int>_>::resize(&this->l_index,(long)iVar13);
  std::vector<double,_std::allocator<double>_>::resize(&this->l_value,(long)iVar13);
  lVar20 = (long)this->num_row;
  if (0 < lVar20) {
    piVar3 = (this_01->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    piVar4 = (this->l_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar7 = (this->l_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar13 = piVar3[lVar20];
    local_230 = (vector<double,std::allocator<double>> *)
                (local_150.index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start + -1);
    local_218 = local_150.value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start + -1;
    do {
      lVar23 = lVar20 + -1;
      iVar14 = (int)uVar24;
      piVar3[lVar20] = iVar14;
      lVar15 = (long)local_150.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar20];
      if (local_150.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[lVar20 + -1] <
          local_150.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[lVar20]) {
        lVar21 = 0;
        do {
          piVar4[(long)iVar14 + lVar21 + -1] =
               *(int *)(local_230 + lVar21 * 4 + lVar15 * 4) + this->num_row;
          pdVar7[(long)iVar14 + lVar21 + -1] = local_218[lVar15 + lVar21];
          lVar22 = lVar15 + lVar21;
          lVar21 = lVar21 + -1;
        } while ((long)local_150.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar23] < lVar22 + -1);
        uVar24 = (ulong)(uint)(iVar14 + (int)lVar21);
      }
      iVar14 = piVar3[lVar23];
      if (piVar3[lVar23] < iVar13) {
        lVar15 = (long)iVar13;
        iVar13 = (int)uVar24;
        lVar21 = 0;
        do {
          piVar4[(long)iVar13 + lVar21 + -1] = piVar4[lVar15 + lVar21 + -1];
          pdVar7[(long)iVar13 + lVar21 + -1] = pdVar7[lVar15 + lVar21 + -1];
          lVar22 = lVar15 + lVar21;
          lVar21 = lVar21 + -1;
        } while ((long)piVar3[lVar23] < lVar22 + -1);
        uVar24 = (ulong)(uint)(iVar13 + (int)lVar21);
        iVar14 = piVar3[lVar23];
      }
      iVar13 = iVar14;
      bVar8 = 1 < lVar20;
      lVar20 = lVar23;
    } while (bVar8);
  }
  std::vector<int,_std::allocator<int>_>::resize(&this->l_pivot_lookup,local_210);
  local_238 = this->num_row;
  if (local_238 < (int)local_220) {
    piVar3 = (local_1e0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    piVar4 = (this->l_pivot_lookup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar20 = 0;
    do {
      piVar4[piVar3[local_238 + lVar20]] = local_238 + (int)lVar20;
      lVar20 = lVar20 + 1;
    } while ((local_200 + (long)local_208) - (long)local_238 != lVar20);
    local_238 = this->num_row;
  }
  local_234 = (int)((ulong)((long)(this->u_index).super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->u_index).super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_start) >> 2);
  if (local_238 < (int)local_220) {
    local_230 = (vector<double,std::allocator<double>> *)&this->u_pivot_index;
    iVar13 = (int)((ulong)((long)(this->u_pivot_index).super__Vector_base<int,_std::allocator<int>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->u_pivot_index).super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_start) >> 2) - local_238;
    do {
      iVar14 = local_238 + iVar13;
      local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)CONCAT44(local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start._4_4_,iVar14);
      iVar5._M_current =
           (this->u_pivot_lookup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar5._M_current ==
          (this->u_pivot_lookup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&this->u_pivot_lookup,iVar5,(int *)&local_1f8);
      }
      else {
        *iVar5._M_current = iVar14;
        (this->u_pivot_lookup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar5._M_current + 1;
      }
      iVar5._M_current =
           (this->u_pivot_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar5._M_current ==
          (this->u_pivot_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)local_230,iVar5,&local_238);
      }
      else {
        *iVar5._M_current = local_238;
        (this->u_pivot_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar5._M_current + 1;
      }
      local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x3ff0000000000000;
      iVar6._M_current =
           (this->u_pivot_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar6._M_current ==
          (this->u_pivot_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (&this->u_pivot_value,iVar6,(double *)&local_1f8);
      }
      else {
        *iVar6._M_current = 1.0;
        (this->u_pivot_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar6._M_current + 1;
      }
      iVar5._M_current =
           (this->u_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar5._M_current ==
          (this->u_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&this->u_start,iVar5,&local_234);
      }
      else {
        *iVar5._M_current = local_234;
        (this->u_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar5._M_current + 1;
      }
      iVar5._M_current =
           (this->u_last_p).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar5._M_current ==
          (this->u_last_p).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&this->u_last_p,iVar5,&local_234);
      }
      else {
        *iVar5._M_current = local_234;
        (this->u_last_p).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar5._M_current + 1;
      }
      local_238 = local_238 + 1;
    } while (local_238 < (int)local_220);
  }
  iVar13 = (uint)(this->update_method == 1) * 5;
  uVar16 = (ulong)((long)(this->ur_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)(this->ur_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start) >> 2;
  iVar26 = (int)uVar16;
  iVar14 = iVar13 * (int)local_228 + iVar26;
  std::vector<int,_std::allocator<int>_>::resize(&this->ur_index,(long)iVar14);
  std::vector<double,_std::allocator<double>_>::resize(&this->ur_value,(long)iVar14);
  local_220 = CONCAT44(local_220._4_4_,iVar14);
  local_210 = (long)(this->ur_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this->ur_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
  uVar24 = local_210 >> 2;
  iVar14 = (int)local_208;
  iVar36 = (int)uVar24;
  printf("\nUpdating UR vectors %d - %d\n",uVar24 & 0xffffffff,(ulong)((iVar14 + iVar36) - 1));
  local_230 = (vector<double,std::allocator<double>> *)&this->ur_start;
  std::vector<int,_std::allocator<int>_>::resize(&this->ur_start,(long)(iVar14 + iVar36 + 1));
  auVar28 = _DAT_003bf640;
  auVar10 = _DAT_003beea0;
  auVar9 = _DAT_003bee90;
  uVar25 = iVar36 + 1;
  sVar19 = (size_type)(int)uVar25;
  __n = (size_type)(iVar14 + iVar36);
  if (0 < iVar14) {
    piVar3 = (((_Vector_base<int,_std::allocator<int>_> *)&local_230->field_0x0)->_M_impl).
             super__Vector_impl_data._M_start;
    sVar17 = sVar19;
    if ((long)sVar19 < (long)__n) {
      sVar17 = __n;
    }
    lVar20 = sVar17 - sVar19;
    auVar30._8_4_ = (int)lVar20;
    auVar30._0_8_ = lVar20;
    auVar30._12_4_ = (int)((ulong)lVar20 >> 0x20);
    uVar18 = 0;
    auVar30 = auVar30 ^ _DAT_003beea0;
    do {
      auVar34._8_4_ = (int)uVar18;
      auVar34._0_8_ = uVar18;
      auVar34._12_4_ = (int)(uVar18 >> 0x20);
      auVar32 = (auVar34 | auVar9) ^ auVar10;
      iVar14 = auVar30._4_4_;
      if ((bool)(~(auVar32._4_4_ == iVar14 && auVar30._0_4_ < auVar32._0_4_ ||
                  iVar14 < auVar32._4_4_) & 1)) {
        piVar3[sVar19 + uVar18] = iVar26;
      }
      if ((auVar32._12_4_ != auVar30._12_4_ || auVar32._8_4_ <= auVar30._8_4_) &&
          auVar32._12_4_ <= auVar30._12_4_) {
        piVar3[sVar19 + uVar18 + 1] = iVar26;
      }
      auVar32 = (auVar34 | auVar28) ^ auVar10;
      iVar36 = auVar32._4_4_;
      if (iVar36 <= iVar14 && (iVar36 != iVar14 || auVar32._0_4_ <= auVar30._0_4_)) {
        piVar3[sVar19 + uVar18 + 2] = iVar26;
        piVar3[sVar19 + uVar18 + 3] = iVar26;
      }
      uVar18 = uVar18 + 4;
    } while ((lVar20 + 4U & 0xfffffffffffffffc) != uVar18);
  }
  local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_238 = 0;
  local_218 = (pointer)uVar24;
  std::vector<int,_std::allocator<int>_>::_M_fill_assign(&local_1f8,__n,&local_238);
  std::vector<int,_std::allocator<int>_>::resize(&this->ur_space,__n);
  this_02 = local_230;
  auVar28 = _DAT_003bf640;
  auVar10 = _DAT_003beea0;
  auVar9 = _DAT_003bee90;
  if (0 < (int)local_228) {
    piVar3 = (this->ur_space).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar20 = (long)(int)local_218;
    sVar17 = lVar20 + 1U;
    if ((long)(lVar20 + 1U) < (long)__n) {
      sVar17 = __n;
    }
    lVar23 = (sVar17 - lVar20) + -1;
    auVar31._8_4_ = (int)lVar23;
    auVar31._0_8_ = lVar23;
    auVar31._12_4_ = (int)((ulong)lVar23 >> 0x20);
    uVar24 = 0;
    auVar31 = auVar31 ^ _DAT_003beea0;
    do {
      auVar35._8_4_ = (int)uVar24;
      auVar35._0_8_ = uVar24;
      auVar35._12_4_ = (int)(uVar24 >> 0x20);
      auVar32 = (auVar35 | auVar9) ^ auVar10;
      iVar14 = auVar31._4_4_;
      if ((bool)(~(auVar32._4_4_ == iVar14 && auVar31._0_4_ < auVar32._0_4_ ||
                  iVar14 < auVar32._4_4_) & 1)) {
        piVar3[lVar20 + uVar24] = iVar13;
      }
      if ((auVar32._12_4_ != auVar31._12_4_ || auVar32._8_4_ <= auVar31._8_4_) &&
          auVar32._12_4_ <= auVar31._12_4_) {
        piVar3[lVar20 + uVar24 + 1] = iVar13;
      }
      auVar32 = (auVar35 | auVar28) ^ auVar10;
      iVar36 = auVar32._4_4_;
      if (iVar36 <= iVar14 && (iVar36 != iVar14 || auVar32._0_4_ <= auVar31._0_4_)) {
        piVar3[lVar20 + uVar24 + 2] = iVar13;
        piVar3[lVar20 + uVar24 + 3] = iVar13;
      }
      uVar24 = uVar24 + 4;
    } while (((sVar17 - lVar20) + 3 & 0xfffffffffffffffc) != uVar24);
  }
  if (0 < local_234) {
    piVar3 = (this->u_pivot_lookup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar4 = (this->u_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar20 = 0;
    do {
      local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[piVar3[piVar4[lVar20]]] =
           local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[piVar3[piVar4[lVar20]]] + 1;
      lVar20 = lVar20 + 1;
    } while (lVar20 < local_234);
  }
  *(int *)((long)(((_Vector_base<int,_std::allocator<int>_> *)&local_230->field_0x0)->_M_impl).
                 super__Vector_impl_data._M_start + ((long)(local_210 << 0x1e) >> 0x1e)) = iVar26;
  if (0 < (int)local_228) {
    lVar20 = sVar19 - 1;
    do {
      iVar14 = local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[lVar20];
      uVar27 = (int)uVar16 + iVar14 + iVar13;
      uVar16 = (ulong)uVar27;
      (((_Vector_base<int,_std::allocator<int>_> *)&this_02->field_0x0)->_M_impl).
      super__Vector_impl_data._M_start[lVar20 + 1] = uVar27;
      printf("ur_start[%d] = %d; gap = %d; iStart = %d\n",(ulong)uVar25,(ulong)uVar27,
             (ulong)(uint)(iVar14 + iVar13),uVar16);
      lVar20 = lVar20 + 1;
      uVar25 = uVar25 + 1;
    } while (lVar20 < (long)__n);
  }
  printf("ur_count_size = %d; iStart%d\n",local_220 & 0xffffffff,uVar16 & 0xffffffff);
  std::vector<int,_std::allocator<int>_>::resize((vector<int,_std::allocator<int>_> *)this_02,__n);
  std::vector<int,_std::allocator<int>_>::resize(&this->ur_lastp,__n);
  if (0 < (int)local_228) {
    piVar3 = (((_Vector_base<int,_std::allocator<int>_> *)&this_02->field_0x0)->_M_impl).
             super__Vector_impl_data._M_start;
    piVar4 = (this->ur_lastp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar20 = (long)(int)local_218;
    do {
      piVar4[lVar20] = piVar3[lVar20];
      lVar20 = lVar20 + 1;
    } while (lVar20 < (long)__n);
  }
  this->num_row = this->num_row + (int)local_228;
  if (local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_150.value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_150.value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_150.index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_150.index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_150.p_end_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_150.p_end_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_150.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_150.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_e0.packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e0.packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_e0.packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e0.packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_e0.iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_e0.iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_e0.cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_e0.cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_e0.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e0.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_e0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_e0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_180.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_180.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_198.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_198.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((pointer)local_1d8._40_8_ != (pointer)0x0) {
    operator_delete((void *)local_1d8._40_8_);
  }
  if ((pointer)local_1d8._16_8_ != (pointer)0x0) {
    operator_delete((void *)local_1d8._16_8_);
  }
  if (local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void HFactor::addRows(const HighsSparseMatrix* ar_matrix) {
  invalidAMatrixAction();
  assert(kExtendInvertWhenAddingRows);
  HighsInt num_new_row = ar_matrix->num_row_;
  HighsInt new_num_row = num_row + num_new_row;
  printf("Adding %" HIGHSINT_FORMAT
         " new rows to HFactor instance: increasing dimension from "
         "%" HIGHSINT_FORMAT " to %" HIGHSINT_FORMAT " \n",
         num_new_row, num_row, new_num_row);

  // Need to know where (if) a column is basic
  vector<HighsInt> in_basis;
  in_basis.assign(num_col, -1);
  for (HighsInt iRow = 0; iRow < num_row; iRow++) {
    HighsInt iVar = basic_index[iRow];
    if (iVar < num_col) in_basis[iVar] = iRow;
  }
  for (HighsInt iRow = num_row; iRow < new_num_row; iRow++) {
    HighsInt iVar = basic_index[iRow];
    assert(iVar >= num_col);
  }
  //  reportLu(kReportLuBoth, true);
  //  reportLu(kReportLuJustL);

  // Create a row-wise sparse matrix containing the new rows of the L
  // matrix - so that a column-wise version can be created (after
  // inserting the rows into the LR matrix) allowing the cew column
  // entries to be inserted efficiently into the L matrix
  HighsSparseMatrix new_lr_rows;
  new_lr_rows.format_ = MatrixFormat::kRowwise;
  new_lr_rows.num_col_ = num_row;
  double expected_density = 0.0;
  HVector rhs;
  rhs.setup(num_row);
  this->lr_start.reserve(new_num_row + 1);
  for (HighsInt inewRow = 0; inewRow < num_new_row; inewRow++) {
    //    printf("\nFor new row %" HIGHSINT_FORMAT "\n", inewRow);
    // Prepare RHS for system U^T.v = r
    rhs.clear();
    rhs.packFlag = true;
    for (HighsInt iEl = ar_matrix->start_[inewRow];
         iEl < ar_matrix->start_[inewRow + 1]; iEl++) {
      HighsInt iCol = ar_matrix->index_[iEl];
      HighsInt basis_index = in_basis[iCol];
      if (basis_index >= 0) {
        rhs.array[basis_index] = ar_matrix->value_[iEl];
        rhs.index[rhs.count++] = basis_index;
      }
    }
    // Solve U^T.v = r
    btranU(rhs, expected_density);
    double local_density = (1.0 * rhs.count) / num_row;
    expected_density = kRunningAverageMultiplier * local_density +
                       (1 - kRunningAverageMultiplier) * expected_density;
    //    printf("New row btranU density: local = %11.4g; expected =  %11.4g\n",
    //    local_density, expected_density);
    rhs.tight();
    //
    // Append v to the matrix containing the new rows of L
    HighsInt rhs_num_nz = rhs.count;
    //    printf("New row has entries:\n");
    for (HighsInt iX = 0; iX < rhs_num_nz; iX++) {
      HighsInt iCol = rhs.index[iX];
      new_lr_rows.index_.push_back(iCol);
      new_lr_rows.value_.push_back(rhs.array[iCol]);
      //      printf("   %4d, %11.4g\n", (int)iCol, rhs.array[iCol]);
    }
    new_lr_rows.start_.push_back(new_lr_rows.index_.size());
    new_lr_rows.num_row_++;

    //
    // Append v to the L matrix
    for (HighsInt iX = 0; iX < rhs_num_nz; iX++) {
      HighsInt iCol = rhs.index[iX];
      lr_index.push_back(iCol);
      lr_value.push_back(rhs.array[iCol]);
    }
    lr_start.push_back(lr_index.size());
    //    reportLu(kReportLuJustL);
  }
  // Now create a column-wise copy of the new rows
  HighsSparseMatrix new_lr_cols = new_lr_rows;
  new_lr_cols.ensureColwise();
  //
  // Insert the column-wise copy into the L matrix
  //
  // Add pivot indices for the new columns
  this->l_pivot_index.resize(new_num_row);
  for (HighsInt iCol = num_row; iCol < new_num_row; iCol++)
    l_pivot_index[iCol] = iCol;
  //
  // Add starts for the identity columns
  HighsInt l_matrix_new_num_nz = lr_index.size();
  assert(l_matrix_new_num_nz ==
         (HighsInt)(l_index.size() + new_lr_cols.index_.size()));
  l_start.resize(new_num_row + 1);
  HighsInt to_el = l_matrix_new_num_nz;
  for (HighsInt iCol = num_row + 1; iCol < new_num_row + 1; iCol++)
    l_start[iCol] = l_matrix_new_num_nz;
  //
  // Insert the new entries, remembering to offset the index values by
  // num_row, since new_lr_cols only has the new rows
  l_index.resize(l_matrix_new_num_nz);
  l_value.resize(l_matrix_new_num_nz);
  for (HighsInt iCol = num_row - 1; iCol >= 0; iCol--) {
    const HighsInt from_el = l_start[iCol + 1];
    l_start[iCol + 1] = to_el;
    for (HighsInt iEl = new_lr_cols.start_[iCol + 1] - 1;
         iEl >= new_lr_cols.start_[iCol]; iEl--) {
      to_el--;
      l_index[to_el] = num_row + new_lr_cols.index_[iEl];
      l_value[to_el] = new_lr_cols.value_[iEl];
    }
    for (HighsInt iEl = from_el - 1; iEl >= l_start[iCol]; iEl--) {
      to_el--;
      l_index[to_el] = l_index[iEl];
      l_value[to_el] = l_value[iEl];
    }
  }
  assert(to_el == 0);
  this->l_pivot_lookup.resize(new_num_row);
  for (HighsInt iRow = num_row; iRow < new_num_row; iRow++)
    l_pivot_lookup[l_pivot_index[iRow]] = iRow;
  // Now update the U matrix with identity rows and columns
  // Allocate space for U factor
  //  reportLu(kReportLuJustL);
  //
  // Now add pivots corresponding to identity columns in U. The use of
  // most arrays in U is self-evident, except for U(R)lastp, which is
  // (one more than) the end of the index/value array that's applied
  // in the *tranU. Here it needs to be equal to the start since there
  // are no non-pivotal entries
  //

  HighsInt u_countX = u_index.size();
  HighsInt u_pivot_lookup_offset = u_pivot_index.size() - num_row;
  for (HighsInt iRow = num_row; iRow < new_num_row; iRow++) {
    u_pivot_lookup.push_back(u_pivot_lookup_offset + iRow);
    u_pivot_index.push_back(iRow);
    u_pivot_value.push_back(1);
    u_start.push_back(u_countX);
    u_last_p.push_back(u_countX);
  }

  // Now, to extend UR
  //
  // UR space
  //
  // Borrowing names from buildFinish()
  HighsInt ur_stuff_size = update_method == kUpdateMethodFt ? 5 : 0;
  HighsInt ur_size = ur_index.size();
  HighsInt ur_count_size = ur_size + ur_stuff_size * num_new_row;
  ur_index.resize(ur_count_size);
  ur_value.resize(ur_count_size);

  // Need to refer to just the new UR vectors
  HighsInt ur_cur_num_vec = ur_start.size();
  HighsInt ur_new_num_vec = ur_cur_num_vec + num_new_row;
  printf("\nUpdating UR vectors %d - %d\n", (int)ur_cur_num_vec,
         (int)ur_new_num_vec - 1);
  // UR pointer
  //
  // Allow space to the start of new rows, including the start for the
  // fictitious ur_new_num_vec'th row
  ur_start.resize(ur_new_num_vec + 1);
  for (HighsInt iRow = ur_cur_num_vec + 1; iRow < ur_new_num_vec + 1; iRow++) {
    ur_start[iRow] = ur_size;
  }
  // NB ur_temp plays the role of ur_lastp when it could be used as
  // temporary storage in buildFinish()
  vector<HighsInt> ur_temp;
  ur_temp.assign(ur_new_num_vec, 0);
  //
  // ur_space has its new entries assigned (to ur_stuff_size) as in
  // buildFinish()
  ur_space.resize(ur_new_num_vec);
  for (HighsInt iRow = ur_cur_num_vec; iRow < ur_new_num_vec; iRow++)
    ur_space[iRow] = ur_stuff_size;
  // Compute ur_temp exactly as in buildFinish()
  for (HighsInt k = 0; k < u_countX; k++) ur_temp[u_pivot_lookup[u_index[k]]]++;
  HighsInt iStart = ur_size;
  ur_start[ur_cur_num_vec] = iStart;
  for (HighsInt iRow = ur_cur_num_vec + 1; iRow < ur_new_num_vec + 1; iRow++) {
    HighsInt gap = ur_temp[iRow - 1] + ur_stuff_size;
    ur_start[iRow] = iStart + gap;
    iStart += gap;
    printf("ur_start[%d] = %d; gap = %d; iStart = %d\n", (int)iRow,
           (int)ur_start[iRow], (int)gap, (int)iStart);
  }
  printf("ur_count_size = %d; iStart%d\n", (int)ur_count_size, (int)iStart);
  // Lose the start for the fictitious ur_new_num_vec'th row
  ur_start.resize(ur_new_num_vec);
  // Resize ur_lastp and initialise its new entries to be the ur_start
  // values since the rows are empty
  ur_lastp.resize(ur_new_num_vec);
  for (HighsInt iRow = ur_cur_num_vec; iRow < ur_new_num_vec; iRow++)
    ur_lastp[iRow] = ur_start[iRow];
  //
  // Increase the number of rows in HFactor
  num_row += num_new_row;
  //  reportLu(kReportLuBoth, true);
}